

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O2

void save_point_list_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  bool bVar1;
  unsigned_short uVar2;
  ostream *poVar3;
  float y;
  float x;
  Am_Point_List list;
  float local_40;
  float local_3c;
  Am_Point_List local_38;
  
  Am_Load_Save_Context::Save_Type_Name(context,os,"Am_POINT_LIST");
  Am_Point_List::Am_Point_List(&local_38,value);
  uVar2 = Am_Point_List::Length(&local_38);
  poVar3 = (ostream *)std::ostream::operator<<(os,uVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  Am_Point_List::Start(&local_38);
  while( true ) {
    bVar1 = Am_Point_List::Last(&local_38);
    if (bVar1) break;
    Am_Point_List::Get(&local_38,&local_3c,&local_40);
    poVar3 = (ostream *)std::ostream::operator<<(os,local_3c);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_40);
    std::endl<char,std::char_traits<char>>(poVar3);
    Am_Point_List::Next(&local_38);
  }
  Am_Point_List::~Am_Point_List(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_point_list,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  context.Save_Type_Name(os, "Am_POINT_LIST");
  Am_Point_List list = value;
  os << list.Length() << std::endl;
  float x, y;
  for (list.Start(); !list.Last(); list.Next()) {
    list.Get(x, y);
    os << x << " " << y << std::endl;
  }
}